

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::bootstrap_pod_type<unsigned_long_long>(string *name,Module *m)

{
  Type_Info ti;
  Module *pMVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  anon_class_1_0_00000001_for_m_f local_d9;
  Proxy_Function local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _func_unsigned_long_long_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_a8;
  Proxy_Function local_a0;
  string local_90;
  Proxy_Function local_70 [2];
  string local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Module *local_18;
  Module *m_local;
  string *name_local;
  
  local_18 = m;
  m_local = (Module *)name;
  user_type<unsigned_long_long>();
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  ti.m_bare_type_info = (type_info *)uStack_28;
  ti.m_type_info = (type_info *)local_30;
  ti._16_8_ = local_20;
  Module::add(m,ti,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pMVar1 = local_18;
  constructor<unsigned_long_long()>();
  std::__cxx11::string::string
            ((string *)&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(pMVar1,local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  construct_pod<unsigned_long_long>((string *)m_local,local_18);
  pMVar1 = local_18;
  local_a8 = parse_string<unsigned_long_long>;
  fun<unsigned_long_long(*)(std::__cxx11::string_const&)>((chaiscript *)&local_a0,&local_a8);
  std::operator+(&local_c8,"to_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(pMVar1,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_a0);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::bootstrap_pod_type<unsigned_long_long>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(unsigned_long_long)_1_>
            ((chaiscript *)&local_d8,&local_d9);
  std::operator+(&local_100,"to_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  Module::add(pMVar1,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_d8);
  return;
}

Assistant:

void bootstrap_pod_type(const std::string &name, Module &m) {
    m.add(user_type<T>(), name);
    m.add(constructor<T()>(), name);
    construct_pod<T>(name, m);

    m.add(fun(&parse_string<T>), "to_" + name);
    m.add(fun([](const T t) { return t; }), "to_" + name);
  }